

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Buffer::Buffer(Buffer *this)

{
  list<int,_std::allocator<int>_> *this_00;
  size_t *psVar1;
  _List_node_base *p_Var2;
  long lVar3;
  
  lVar3 = 0;
  do {
    Block::Block((Block *)(this->buffer[0].data + lVar3 + -0x24));
    lVar3 = lVar3 + 0x2028;
  } while (lVar3 != 0x2832000);
  (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->Empty_Block;
  (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->Empty_Block;
  (this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  this_00 = &this->Occupy_Block;
  (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  lVar3 = 0;
  do {
    p_Var2 = (_List_node_base *)operator_new(0x18);
    *(int *)&p_Var2[1]._M_next = (int)lVar3;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
    this->Dirty[lVar3] = 0;
    this->Pin[lVar3] = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1400);
  std::__cxx11::list<int,_std::allocator<int>_>::clear(this_00);
  return;
}

Assistant:

Buffer::Buffer(void){
	int i;
	for (i = 0; i < MAX_BLOCKS; i++) {
		this->Empty_Block.push_back(i);
		this->UnDirt(i);
		this->UnLock(i);
	}
	this->Occupy_Block.clear();
}